

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O2

bool __thiscall RTIMUHal::I2CSelectSlave(RTIMUHal *this,uchar slaveAddr,char *errorMsg)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  uchar uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  
  uVar5 = CONCAT71(in_register_00000031,slaveAddr) & 0xffffffff;
  bVar3 = true;
  uVar4 = (uchar)uVar5;
  if (this->m_currentSlave != uVar4) {
    bVar1 = HALOpen(this);
    if (bVar1) {
      iVar2 = ioctl(this->m_I2C,0x703,uVar5);
      if (iVar2 < 0) {
        bVar3 = false;
        fprintf(_stderr,"I2C slave select %d failed - %s\n",
                CONCAT71(in_register_00000031,slaveAddr) & 0xffffffff,errorMsg);
      }
      else {
        this->m_currentSlave = uVar4;
      }
    }
    else {
      bVar3 = false;
      fprintf(_stderr,"Failed to open I2C port - %s\n",errorMsg);
    }
  }
  return bVar3;
}

Assistant:

bool RTIMUHal::I2CSelectSlave(unsigned char slaveAddr, const char *errorMsg)
{
    if (m_currentSlave == slaveAddr)
        return true;

    if (!HALOpen()) {
        HAL_ERROR1("Failed to open I2C port - %s\n", errorMsg);
        return false;
    }

    if (ioctl(m_I2C, I2C_SLAVE, slaveAddr) < 0) {
        HAL_ERROR2("I2C slave select %d failed - %s\n", slaveAddr, errorMsg);
        return false;
    }

    m_currentSlave = slaveAddr;

    return true;
}